

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O2

bool __thiscall
VW::config::options_serializer_boost_po::
serialize_if_t<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (options_serializer_boost_po *this,base_option *base_option)

{
  size_t sVar1;
  size_t sVar2;
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *ptVar3;
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> typed;
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_c0;
  
  sVar1 = base_option->m_type_hash;
  sVar2 = std::type_info::hash_code
                    ((type_info *)
                     &std::vector<unsigned_long,std::allocator<unsigned_long>>::typeinfo);
  if (sVar1 == sVar2) {
    ptVar3 = (typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             __dynamic_cast(base_option,&config::base_option::typeinfo,
                            &typed_option<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                             ::typeinfo,0);
    if (ptVar3 == (typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x0)
    {
      __cxa_bad_cast();
    }
    typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::typed_option
              (&local_c0,ptVar3);
    serialize<unsigned_long>(this,&local_c0);
    typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~typed_option
              (&local_c0);
  }
  return sVar1 == sVar2;
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }